

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_font_x.cxx
# Opt level: O3

char * put_font_size(char *n,int size)

{
  bool bVar1;
  uint uVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  char *__ptr;
  char *pcVar9;
  char *pcVar10;
  long lVar12;
  char *pcVar13;
  ulong uVar14;
  int iVar15;
  ulong uVar16;
  int iVar17;
  int cnt;
  int local_478;
  long *local_470;
  uint local_464;
  char *local_460;
  char *local_458;
  char *local_450;
  ulong local_448;
  ulong local_440;
  char local_438 [1032];
  size_t sVar11;
  
  __ptr = strdup(n);
  iVar15 = 1;
  pcVar9 = __ptr;
  do {
    if (*pcVar9 == ',') {
      iVar15 = iVar15 + 1;
      *pcVar9 = '\0';
    }
    else if (*pcVar9 == '\0') {
      pcVar9 = (char *)malloc((long)(iVar15 << 8));
      *pcVar9 = '\0';
      lVar12 = 0;
      if (0 < iVar15) {
        uVar14 = 0;
        local_470 = find_best_font(char_const*,int)::list;
        local_458 = __ptr;
        local_450 = pcVar9;
        do {
          if (local_470 != (long *)0x0) {
            XFreeFontNames();
          }
          find_best_font(char_const*,int)::list =
               (long *)XListFonts(fl_display,__ptr,100,&local_464);
          if (find_best_font(char_const*,int)::list == (long *)0x0) {
            local_470 = (long *)0x0;
            pcVar13 = "fixed";
          }
          else {
            pcVar13 = (char *)*find_best_font(char_const*,int)::list;
            pcVar9 = local_450;
            local_470 = find_best_font(char_const*,int)::list;
            local_448 = uVar14;
            if (local_464 != 0) {
              uVar2 = -local_464;
              if (0 < (int)local_464) {
                uVar2 = local_464;
              }
              local_440 = (ulong)uVar2;
              local_478 = 0x7fff;
              uVar16 = 0;
              bVar1 = false;
              iVar8 = 0;
              do {
                pcVar9 = (char *)local_470[uVar16];
                local_460 = pcVar13;
                iVar5 = fl_correct_encoding(pcVar9);
                if (iVar5 == 0) {
                  bVar3 = !bVar1;
                  pcVar13 = local_460;
                  iVar5 = iVar8;
                  iVar17 = local_478;
                  bVar1 = true;
                  if (bVar3) {
                    bVar1 = false;
                    goto LAB_001ecede;
                  }
                }
                else {
                  if (!bVar1) {
                    iVar8 = 0;
                  }
                  bVar1 = true;
LAB_001ecede:
                  pcVar10 = fl_find_fontsize(pcVar9);
                  if (pcVar10 == (char *)0x0) {
                    iVar6 = 0x7fff;
                  }
                  else {
                    iVar6 = atoi(pcVar10);
                  }
                  sVar11 = strlen(pcVar9);
                  iVar7 = (int)sVar11;
                  pcVar13 = pcVar9;
                  iVar5 = size;
                  iVar17 = iVar7;
                  if ((iVar6 != size) || (local_478 <= iVar7)) {
                    if ((iVar6 == 0) && (iVar8 != size)) {
                      iVar17 = (int)pcVar10 - (int)pcVar9;
                      memcpy(local_438,pcVar9,(long)iVar17);
                      iVar8 = sprintf(local_438 + iVar17,"%d",(ulong)(uint)size);
                      local_470 = find_best_font(char_const*,int)::list;
                      pcVar10 = pcVar10 + -1;
                      do {
                        pcVar9 = pcVar10 + 1;
                        pcVar10 = pcVar10 + 1;
                      } while (*pcVar9 == '0');
                      strcpy(local_438 + (iVar8 + iVar17),pcVar10);
                      pcVar13 = local_438;
                      iVar17 = local_478;
                    }
                    else {
                      iVar5 = iVar6;
                      if ((iVar8 != 0) &&
                         (((iVar8 <= size || (iVar8 <= iVar6)) &&
                          (pcVar13 = local_460, iVar5 = iVar8, iVar17 = local_478,
                          iVar6 <= size && iVar8 < iVar6)))) {
                        pcVar13 = pcVar9;
                        iVar5 = iVar6;
                        iVar17 = iVar7;
                      }
                    }
                  }
                }
                uVar16 = uVar16 + 1;
                uVar14 = local_448;
                pcVar9 = local_450;
                local_478 = iVar17;
                iVar8 = iVar5;
              } while (uVar16 != local_440);
            }
          }
          cVar4 = *pcVar13;
          if (cVar4 != '\0') {
            lVar12 = 0;
            do {
              pcVar9[lVar12 + (int)uVar14] = cVar4;
              cVar4 = pcVar13[lVar12 + 1];
              lVar12 = lVar12 + 1;
            } while (cVar4 != '\0');
            uVar14 = (ulong)(uint)((int)uVar14 + (int)lVar12);
          }
          do {
            pcVar13 = __ptr;
            __ptr = pcVar13 + 1;
          } while (*pcVar13 != '\0');
          if (iVar15 + -1 != 0) {
            pcVar9[(int)uVar14] = ',';
            uVar14 = (ulong)((int)uVar14 + 1);
            pcVar13 = pcVar13 + 1;
          }
          __ptr = pcVar13 + -1;
          do {
            pcVar13 = __ptr + 1;
            __ptr = __ptr + 1;
            iVar8 = isspace((int)*pcVar13);
          } while (iVar8 != 0);
          bVar1 = 1 < iVar15;
          iVar15 = iVar15 + -1;
        } while (bVar1);
        lVar12 = (long)(int)uVar14;
        __ptr = local_458;
      }
      pcVar9[lVar12] = '\0';
      free(__ptr);
      return pcVar9;
    }
    pcVar9 = pcVar9 + 1;
  } while( true );
}

Assistant:

static char *put_font_size(const char *n, int size)
{
        int i = 0;
        char *buf;
        const char *ptr;
        const char *f;
        char *name;
        int nbf = 1;
        name = strdup(n);
        while (name[i]) {
                if (name[i] == ',') {nbf++; name[i] = '\0';}
                i++;
        }

        buf = (char*) malloc(nbf * 256);
        buf[0] = '\0';
        ptr = name;
        i = 0;
        while (ptr && nbf > 0) {
                f = find_best_font(ptr, size);
                while (*f) {
                        buf[i] = *f;
                        f++; i++;
                }
                nbf--;
                while (*ptr) ptr++;
                if (nbf) {
                        ptr++;
                        buf[i] = ',';
                        i++;
                }
                while(isspace(*ptr)) ptr++;
        }
        buf[i] = '\0';
        free(name);
        return buf;
}